

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

bool __thiscall absl::lts_20250127::Mutex::ReaderTryLockSlow(Mutex *this)

{
  ulong uVar1;
  int local_6c;
  ulong uStack_68;
  int loop_limit;
  intptr_t v;
  Mutex *this_local;
  ulong local_50;
  memory_order local_48;
  int local_44;
  memory_order __b;
  undefined1 local_31;
  long local_30;
  undefined4 local_28;
  undefined4 local_24;
  long local_20;
  undefined1 *local_18;
  Mutex *local_10;
  
  local_44 = 0;
  v = (intptr_t)this;
  ___b = this;
  local_48 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_44 - 1U < 2) {
    local_50 = (this->mu_).super___atomic_base<long>._M_i;
  }
  else if (local_44 == 5) {
    local_50 = (this->mu_).super___atomic_base<long>._M_i;
  }
  else {
    local_50 = (this->mu_).super___atomic_base<long>._M_i;
  }
  uStack_68 = local_50;
  local_6c = 5;
  do {
    if (local_6c == 0) {
      PostSynchEvent(this,3);
      return false;
    }
    uVar1 = uStack_68;
    if ((uStack_68 & 0xc) == 0) {
      local_30 = (uStack_68 | 1) + 0x100;
      local_18 = (undefined1 *)&stack0xffffffffffffff98;
      local_24 = 2;
      local_28 = 0;
      LOCK();
      uVar1 = (this->mu_).super___atomic_base<long>._M_i;
      local_31 = uStack_68 == uVar1;
      if ((bool)local_31) {
        (this->mu_).super___atomic_base<long>._M_i = local_30;
        uVar1 = uStack_68;
      }
      UNLOCK();
      local_20 = local_30;
      local_10 = this;
      if ((bool)local_31) {
        DebugOnlyLockEnter(this);
        PostSynchEvent(this,2);
        return true;
      }
    }
    uStack_68 = uVar1;
    local_6c = local_6c + -1;
  } while( true );
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE bool Mutex::ReaderTryLockSlow() {
  intptr_t v = mu_.load(std::memory_order_relaxed);
#if defined(__clang__)
#pragma nounroll
#endif
  for (int loop_limit = 5; loop_limit != 0; loop_limit--) {
    if ((v & kShared->slow_need_zero) == 0 &&
        mu_.compare_exchange_strong(v, (kMuReader | v) + kMuOne,
                                    std::memory_order_acquire,
                                    std::memory_order_relaxed)) {
      DebugOnlyLockEnter(this);
      PostSynchEvent(this, SYNCH_EV_READERTRYLOCK_SUCCESS);
      ABSL_TSAN_MUTEX_POST_LOCK(
          this, __tsan_mutex_read_lock | __tsan_mutex_try_lock, 0);
      return true;
    }
  }
  PostSynchEvent(this, SYNCH_EV_READERTRYLOCK_FAILED);
  ABSL_TSAN_MUTEX_POST_LOCK(this,
                            __tsan_mutex_read_lock | __tsan_mutex_try_lock |
                                __tsan_mutex_try_lock_failed,
                            0);
  return false;
}